

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void glfwMakeContextCurrent(GLFWwindow *handle)

{
  void *pvVar1;
  long in_RDI;
  _GLFWwindow *previous;
  _GLFWwindow *window;
  
  pvVar1 = _glfwPlatformGetTls((_GLFWtls *)0x1dedb6);
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((in_RDI == 0) || (*(int *)(in_RDI + 0x1f0) != 0)) {
    if ((pvVar1 != (void *)0x0) &&
       ((in_RDI == 0 || (*(int *)(in_RDI + 500) != *(int *)((long)pvVar1 + 500))))) {
      (**(code **)((long)pvVar1 + 0x238))(0);
    }
    if (in_RDI != 0) {
      (**(code **)(in_RDI + 0x238))(in_RDI);
    }
  }
  else {
    _glfwInputError(0x1000a,
                    "Cannot make current with a window that has no OpenGL or OpenGL ES context");
  }
  return;
}

Assistant:

GLFWAPI void glfwMakeContextCurrent(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFWwindow* previous = _glfwPlatformGetTls(&_glfw.contextSlot);

    _GLFW_REQUIRE_INIT();

    if (window && window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT,
                        "Cannot make current with a window that has no OpenGL or OpenGL ES context");
        return;
    }

    if (previous)
    {
        if (!window || window->context.source != previous->context.source)
            previous->context.makeCurrent(NULL);
    }

    if (window)
        window->context.makeCurrent(window);
}